

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qspinbox.cpp
# Opt level: O2

void __thiscall
QDoubleSpinBoxPrivate::emitSignals(QDoubleSpinBoxPrivate *this,EmitPolicy ep,QVariant *old)

{
  undefined1 *puVar1;
  QDoubleSpinBox *this_00;
  bool bVar2;
  long in_FS_OFFSET;
  double _t1;
  QArrayDataPointer<char16_t> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (ep != NeverEmit) {
    this_00 = *(QDoubleSpinBox **)
               &(this->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate.field_0x8;
    puVar1 = &(this->super_QAbstractSpinBoxPrivate).field_0x3d0;
    *puVar1 = *puVar1 & 0xfe;
    if (ep != AlwaysEmit) {
      bVar2 = ::operator!=(&(this->super_QAbstractSpinBoxPrivate).value,old);
      if (!bVar2) goto LAB_00444cea;
    }
    QLineEdit::displayText((QString *)&QStack_38,(this->super_QAbstractSpinBoxPrivate).edit);
    QDoubleSpinBox::textChanged(this_00,(QString *)&QStack_38);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_38);
    _t1 = (double)::QVariant::toDouble((bool *)&(this->super_QAbstractSpinBoxPrivate).value);
    QDoubleSpinBox::valueChanged(this_00,_t1);
  }
LAB_00444cea:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDoubleSpinBoxPrivate::emitSignals(EmitPolicy ep, const QVariant &old)
{
    Q_Q(QDoubleSpinBox);
    if (ep != NeverEmit) {
        pendingEmit = false;
        if (ep == AlwaysEmit || value != old) {
            emit q->textChanged(edit->displayText());
            emit q->valueChanged(value.toDouble());
        }
    }
}